

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::half>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,half *v)

{
  bool bVar1;
  pointer pSVar2;
  value_type *pvVar3;
  pointer pSVar4;
  optional<tinyusdz::value::half> pv;
  optional<tinyusdz::value::half> local_30;
  optional<tinyusdz::value::half> local_2c;
  double local_28;
  
  if (v == (half *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_28 = t;
    get_default_value<tinyusdz::value::half>(&local_30,this);
    local_2c.has_value_ = local_30.has_value_;
    if (local_30.has_value_ == true) goto LAB_001317f0;
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = local_28;
    if (pSVar2 == pSVar4) {
      return false;
    }
  }
  else {
    pSVar2 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar4 != pSVar2) {
    bVar1 = tinyusdz::value::TimeSamples::get<tinyusdz::value::half,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar1;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    get_default_value<tinyusdz::value::half>(&local_30,this);
    local_2c.has_value_ = local_30.has_value_;
    if (local_30.has_value_ != false) {
LAB_001317f0:
      local_2c.contained = local_30.contained;
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_2c);
      v->value = pvVar3->value;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }